

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O0

void __thiscall
Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
          (Parser *this,ParseNodePtr patternNode,anon_class_16_2_85211fcd handler)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeBin *pPVar3;
  undefined4 *puVar4;
  ParseNodeArrLit *pPVar5;
  ParseNodeUni *pPVar6;
  Parser *local_20;
  ParseNodePtr patternNode_local;
  anon_class_16_2_85211fcd handler_local;
  
  handler_local.this = handler.this;
  local_20 = this;
  patternNode_local = patternNode;
  if (*(char *)&(this->m_nodeAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                super_Allocator.outOfMemoryFunc == '1') {
    pPVar3 = ParseNode::AsParseNodeBin((ParseNode *)this);
    local_20 = (Parser *)pPVar3->pnode1;
  }
  bVar2 = ParseNode::IsPattern((ParseNode *)local_20);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2e8,"(patternNode->IsPattern())","patternNode->IsPattern()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (*(char *)&(local_20->m_nodeAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                super_Allocator.outOfMemoryFunc == 'r') {
    pPVar5 = ParseNode::AsParseNodeArrLit((ParseNode *)local_20);
    ForEachItemInList<Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>(ParseNode*,ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1)::_lambda(ParseNode*)_1_>
              ((pPVar5->super_ParseNodeUni).pnode1,(anon_class_16_2_85211fcd *)&patternNode_local);
  }
  else {
    pPVar6 = ParseNode::AsParseNodeUni((ParseNode *)local_20);
    ForEachItemInList<Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>(ParseNode*,ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1)::_lambda(ParseNode*)_2_>
              (pPVar6->pnode1,(anon_class_16_2_85211fcd *)&patternNode_local);
  }
  return;
}

Assistant:

static void MapBindIdentifier(ParseNodePtr patternNode, THandler handler)
    {
        if (patternNode->nop == knopAsg)
        {
            patternNode = patternNode->AsParseNodeBin()->pnode1;
        }

        Assert(patternNode->IsPattern());
        if (patternNode->nop == knopArrayPattern)
        {
            ForEachItemInList(patternNode->AsParseNodeArrLit()->pnode1, [&](ParseNodePtr item) {
                MapBindIdentifierFromElement(item, handler);
            });
        }
        else
        {
            ForEachItemInList(patternNode->AsParseNodeUni()->pnode1, [&](ParseNodePtr item) {
                Assert(item->nop == knopObjectPatternMember || item->nop == knopEllipsis);
                if (item->nop == knopObjectPatternMember)
                {
                    MapBindIdentifierFromElement(item->AsParseNodeBin()->pnode2, handler);
                }
                else
                {
                    MapBindIdentifierFromElement(item->AsParseNodeUni()->pnode1, handler);
                }
            });
        }
    }